

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

QString * __thiscall
QUrlQueryPrivate::recodeToUser
          (QString *__return_storage_ptr__,QUrlQueryPrivate *this,QString *input,
          ComponentFormattingOptions encoding)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  Data *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  qsizetype qVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QStringView in;
  QStringView in_00;
  undefined1 local_38 [16];
  qsizetype local_28;
  uint local_20;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QFlagsStorage<QUrl::ComponentFormattingOption>)
      encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
      super_QFlagsStorage<QUrl::ComponentFormattingOption>.i ==
      (QFlagsStorage<QUrl::ComponentFormattingOption>)0x0) {
    pDVar4 = (input->d).d;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = (input->d).ptr;
    (__return_storage_ptr__->d).size = (input->d).size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (((uint)encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i & 0xc00000) == 0) {
      local_38 = (undefined1  [16])0x0;
      local_28 = 0;
      in_00.m_data = (input->d).ptr;
      in_00.m_size = (input->d).size;
      lVar8 = qt_urlRecode((QString *)local_38,in_00,encoding,(ushort *)0x0);
    }
    else {
      uVar1 = this->valueDelimiter;
      uVar2 = this->pairDelimiter;
      uVar3 = *(undefined4 *)&this->field_0x24;
      auVar9._4_4_ = uVar3;
      auVar9._2_2_ = uVar2;
      auVar9._0_2_ = uVar1;
      auVar9._8_8_ = 0;
      auVar9 = pshuflw(auVar9,auVar9,0xe1);
      _local_20 = CONCAT44(0x223,auVar9._0_4_ | (uint)DAT_004de0f0);
      local_38 = (undefined1  [16])0x0;
      local_28 = 0;
      in.m_data = (input->d).ptr;
      in.m_size = (input->d).size;
      lVar8 = qt_urlRecode((QString *)local_38,in,encoding,(ushort *)&local_20);
    }
    qVar7 = local_28;
    if (lVar8 == 0) {
      pDVar4 = (input->d).d;
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr = (input->d).ptr;
      (__return_storage_ptr__->d).size = (input->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      uVar5 = local_38._0_8_;
      uVar6 = local_38._8_8_;
      local_38 = ZEXT816(0);
      (__return_storage_ptr__->d).d = (Data *)uVar5;
      (__return_storage_ptr__->d).ptr = (char16_t *)uVar6;
      local_28 = 0;
      (__return_storage_ptr__->d).size = qVar7;
    }
    if ((QArrayData *)local_38._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_38._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString QUrlQueryPrivate::recodeToUser(const QString &input, QUrl::ComponentFormattingOptions encoding) const
{
    // our internal formats are stored in "PrettyDecoded" form
    // and there are no ambiguous characters
    if (idempotentRecodeToUser(encoding))
        return input;

    if (!(encoding & QUrl::EncodeDelimiters)) {
        QString output;
        if (qt_urlRecode(output, input,
                         encoding, nullptr))
            return output;
        return input;
    }

    // re-encode the "#" character and the query delimiter pair
    ushort actions[] = { encode(pairDelimiter.unicode()), encode(valueDelimiter.unicode()),
                         encode('#'), 0 };
    QString output;
    if (qt_urlRecode(output, input, encoding, actions))
        return output;
    return input;
}